

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_data.hpp
# Opt level: O0

BatchedBufferedData * __thiscall
duckdb::BufferedData::Cast<duckdb::BatchedBufferedData>(BufferedData *this)

{
  string *msg;
  BatchedBufferedData *in_RDI;
  allocator *this_00;
  allocator local_29;
  string local_28 [40];
  
  if ((in_RDI->super_BufferedData).type != BATCHED) {
    msg = (string *)__cxa_allocate_exception(0x10);
    this_00 = &local_29;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_28,"Failed to cast buffered data to type - buffered data type mismatch",this_00
              );
    InternalException::InternalException((InternalException *)this_00,msg);
    __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return in_RDI;
}

Assistant:

TARGET &Cast() {
		if (TARGET::TYPE != type) {
			throw InternalException("Failed to cast buffered data to type - buffered data type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}